

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::EnforceDirectoryLevelRules(cmMakefile *this)

{
  cmake *pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  ostringstream msg;
  string local_1a8;
  undefined1 local_188 [376];
  
  if (this->CheckCMP0000 == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"No cmake_minimum_required command is present.  ",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"A line of code such as\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"  cmake_minimum_required(VERSION ",0x21);
    cmVersion::GetMajorVersion();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    cmVersion::GetMinorVersion();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"should be added at the top of the file.  ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"The version specified may be lower if you wish to ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"support older CMake versions for this project.  ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"For more information run ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\"cmake --help-policy CMP0000\".",0x1e);
    PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0000);
    if (PVar2 - NEW < 3) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1a8,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else if (PVar2 == WARN) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1a8,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  }
  return;
}

Assistant:

void cmMakefile::EnforceDirectoryLevelRules() const
{
  // Diagnose a violation of CMP0000 if necessary.
  if (this->CheckCMP0000) {
    std::ostringstream msg;
    msg << "No cmake_minimum_required command is present.  "
        << "A line of code such as\n"
        << "  cmake_minimum_required(VERSION " << cmVersion::GetMajorVersion()
        << "." << cmVersion::GetMinorVersion() << ")\n"
        << "should be added at the top of the file.  "
        << "The version specified may be lower if you wish to "
        << "support older CMake versions for this project.  "
        << "For more information run "
        << "\"cmake --help-policy CMP0000\".";
    switch (this->GetPolicyStatus(cmPolicies::CMP0000)) {
      case cmPolicies::WARN:
        // Warn because the user did not provide a mimimum required
        // version.
        this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                               msg.str(), this->Backtrace);
      case cmPolicies::OLD:
        // OLD behavior is to use policy version 2.4 set in
        // cmListFileCache.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // NEW behavior is to issue an error.
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str(),
                                               this->Backtrace);
        cmSystemTools::SetFatalErrorOccured();
        return;
    }
  }
}